

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264e_dpb.c
# Opt level: O1

void h264e_dpb_check(H264eDpb *dpb,EncCpbStatus *cpb)

{
  int iVar1;
  uint uVar2;
  H264eDpbFrm *pHVar3;
  H264eDpbFrm *pHVar4;
  uint uVar5;
  char *pcVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  H264eDpbFrm *pHVar10;
  uint local_54;
  
  pHVar3 = dpb->curr;
  pHVar4 = dpb->refr;
  if ((h264e_debug._1_1_ & 1) != 0) {
    _mpp_log_l(4,"h264e_dpb","enter %p\n","h264e_dpb_check",dpb);
  }
  if ((h264e_debug._1_1_ & 1) != 0) {
    _mpp_log_l(4,"h264e_dpb","frm %d refr -> frm %d ready\n","h264e_dpb_check",
               (ulong)(uint)pHVar3->seq_idx,(ulong)(uint)pHVar4->seq_idx);
  }
  uVar9 = (pHVar3->status).val;
  if ((uVar9 & 0x40) == 0) {
    iVar1 = dpb->used_size;
    uVar5 = dpb->dpb_size;
    if ((h264e_debug._1_1_ & 1) != 0) {
      pcVar6 = "lt";
      if (-1 < (char)uVar9) {
        pcVar6 = "st";
      }
      _mpp_log_l(4,"h264e_dpb","frm %d %s insert dpb used %d max %d\n","h264e_dpb_check",
                 (ulong)(uint)pHVar3->seq_idx,pcVar6,iVar1,uVar5);
    }
    uVar9 = (ulong)(iVar1 + 1);
    if (((ulong)pHVar3->status & 0x80) == 0) {
      dpb->st_size = dpb->st_size + 1;
    }
    else {
      iVar1 = pHVar3->lt_idx;
      dpb->lt_size = dpb->lt_size + 1;
      if (0 < dpb->total_cnt) {
        pHVar4 = dpb->frames;
        lVar7 = 0;
        do {
          if (((pHVar4 != pHVar3) && (*(char *)&pHVar4->field_2 != '\0')) &&
             (((pHVar4->status).val & 1) != 0)) {
            if ((((pHVar4->status).val & 0x40) != 0) &&
               (_mpp_log_l(2,"h264e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,
                           "!tmp->status.is_non_ref","h264e_dpb_check",0x282),
               (mpp_debug._3_1_ & 0x10) != 0)) goto LAB_0023b3a5;
            if (((char)(pHVar4->status).val < '\0') && (pHVar4->lt_idx == iVar1)) {
              *(undefined1 *)&pHVar4->field_2 = 0;
              (pHVar4->status).val = (pHVar4->status).val & 0xfffffffffffffffe;
              if ((h264e_debug._1_1_ & 1) != 0) {
                _mpp_log_l(4,"h264e_dpb","frm %d lt_idx %d replace %d\n","h264e_dpb_check",
                           (ulong)(uint)pHVar3->seq_idx,(ulong)(uint)pHVar3->lt_idx,pHVar4->slot_idx
                          );
              }
              dpb->lt_size = dpb->lt_size + -1;
              uVar9 = (ulong)((int)uVar9 - 1);
            }
          }
          lVar7 = lVar7 + 1;
          pHVar4 = pHVar4 + 1;
        } while (lVar7 < dpb->total_cnt);
      }
    }
    if ((int)uVar5 < (int)uVar9) {
      if (((int)uVar5 < dpb->lt_size) &&
         (_mpp_log_l(2,"h264e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,
                     "dpb->lt_size <= dpb_size","h264e_dpb_check",0x295),
         (mpp_debug._3_1_ & 0x10) != 0)) goto LAB_0023b3a5;
      do {
        uVar8 = (uint)uVar9;
        if ((int)uVar8 <= (int)uVar5) break;
        if ((h264e_debug._1_1_ & 1) != 0) {
          _mpp_log_l(4,"h264e_dpb","sliding window cpb proc: st %d lt %d max %d\n","h264e_dpb_check"
                     ,(ulong)(uint)dpb->st_size,(ulong)(uint)dpb->lt_size,uVar5);
        }
        if (dpb->total_cnt < 1) {
          pHVar4 = (H264eDpbFrm *)0x0;
        }
        else {
          local_54 = 0x7fffffff;
          lVar7 = 0;
          pHVar4 = (H264eDpbFrm *)0x0;
          pHVar10 = dpb->frames;
          do {
            if ((h264e_debug._1_1_ & 1) != 0) {
              _mpp_log_l(4,"h264e_dpb","frm %d num %d poc %d\n","h264e_dpb_check",
                         (ulong)(uint)pHVar10->seq_idx,(ulong)(uint)pHVar10->frame_num,pHVar10->poc)
              ;
            }
            if (((pHVar10->as_pskip_ref == 0) && ((pHVar10->field_2).on_used != 0)) &&
               (((pHVar10->status).val & 1) != 0)) {
              if ((((pHVar10->status).val & 0x40) != 0) &&
                 (_mpp_log_l(2,"h264e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,
                             "!tmp->status.is_non_ref","h264e_dpb_check",0x2ad),
                 (mpp_debug._3_1_ & 0x10) != 0)) goto LAB_0023b3a5;
              if ((((ulong)pHVar10->status & 0x80) == 0) &&
                 ((uVar2 = pHVar10->poc, (int)uVar2 < (int)local_54 &&
                  (pHVar4 = pHVar10, local_54 = uVar2, (h264e_debug._1_1_ & 1) != 0)))) {
                _mpp_log_l(4,"h264e_dpb","frm %d update smallest poc to %d\n","h264e_dpb_check",
                           (ulong)(uint)pHVar10->seq_idx,(ulong)uVar2);
              }
            }
            lVar7 = lVar7 + 1;
            pHVar10 = pHVar10 + 1;
          } while (lVar7 < dpb->total_cnt);
        }
        if (pHVar4 != (H264eDpbFrm *)0x0) {
          if ((h264e_debug._1_1_ & 1) != 0) {
            _mpp_log_l(4,"h264e_dpb","removing frm %d poc %d\n","h264e_dpb_check",
                       (ulong)(uint)pHVar4->seq_idx,(ulong)(uint)pHVar4->poc);
          }
          *(undefined1 *)&pHVar4->field_2 = 0;
          iVar1 = dpb->st_size;
          dpb->st_size = iVar1 + -1;
          if ((iVar1 < 1) &&
             (_mpp_log_l(2,"h264e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,
                         "dpb->st_size >= 0","h264e_dpb_check",0x2c1), (mpp_debug._3_1_ & 0x10) != 0
             )) goto LAB_0023b3a5;
          uVar8 = uVar8 - 1;
        }
        uVar9 = (ulong)uVar8;
      } while (pHVar4 != (H264eDpbFrm *)0x0);
    }
    dpb->used_size = (int)uVar9;
    if ((int)uVar5 < (int)uVar9) {
      _mpp_log_l(2,"h264e_dpb","error found used_size %d > dpb_size %d\n","h264e_dpb_check",uVar9,
                 (ulong)uVar5);
      _mpp_log_l(2,"h264e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,"used_size <= dpb_size",
                 "h264e_dpb_check",0x2cb);
      if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_0023b3a5;
    }
  }
  else {
    *(undefined1 *)&pHVar3->field_2 = 0;
    (pHVar3->status).val = uVar9 & 0xfffffffffffffffe;
  }
  if ((h264e_debug._1_1_ & 1) != 0) {
    _mpp_log_l(4,"h264e_dpb","curr %d done used_size %d\n","h264e_dpb_check",
               (ulong)(uint)pHVar3->seq_idx,(ulong)(uint)dpb->used_size);
  }
  lVar7 = 0;
  uVar5 = 0;
  do {
    pHVar4 = find_cpb_frame(dpb,(EncFrmStatus *)((long)cpb->final + lVar7));
    *(H264eDpbFrm **)((long)dpb->map + lVar7) = pHVar4;
    uVar5 = (uVar5 + 1) - (uint)(pHVar4 == (H264eDpbFrm *)0x0);
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x40);
  if ((h264e_debug._1_1_ & 1) != 0) {
    _mpp_log_l(4,"h264e_dpb","curr %d cpb final used_size %d vs %d\n","h264e_dpb_check",
               (ulong)(uint)pHVar3->seq_idx,(ulong)uVar5,dpb->used_size);
  }
  if ((dpb->used_size == uVar5) ||
     (_mpp_log_l(2,"h264e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "dpb->used_size == used_size","h264e_dpb_check",0x2da),
     (mpp_debug._3_1_ & 0x10) == 0)) {
    if ((h264e_debug._1_1_ & 1) != 0) {
      _mpp_log_l(4,"h264e_dpb","leave %p\n","h264e_dpb_check",dpb);
      return;
    }
    return;
  }
LAB_0023b3a5:
  abort();
}

Assistant:

void h264e_dpb_check(H264eDpb *dpb, EncCpbStatus *cpb)
{
    H264eDpbFrm *curr = dpb->curr;
    H264eDpbFrm *refr = dpb->refr;
    RK_S32 i;

    h264e_dbg_dpb("enter %p\n", dpb);

    h264e_dbg_dpb("frm %d refr -> frm %d ready\n",
                  curr->seq_idx, refr->seq_idx);

    if (curr->status.is_non_ref) {
        curr->dpb_used = 0;
        curr->status.valid = 0;
    } else {
        /* sliding window process */
        RK_S32 used_size = dpb->used_size;
        RK_S32 dpb_size = dpb->dpb_size;

        h264e_dbg_dpb("frm %d %s insert dpb used %d max %d\n",
                      curr->seq_idx, curr->status.is_lt_ref ? "lt" : "st",
                      used_size, dpb_size);

        used_size++;

        /* replace lt ref with same lt_idx */
        if (curr->status.is_lt_ref) {
            RK_S32 lt_idx = curr->lt_idx;

            dpb->lt_size++;

            for (i = 0; i < dpb->total_cnt; i++) {
                H264eDpbFrm *tmp = &dpb->frames[i];

                if (tmp == curr)
                    continue;

                if (!tmp->dpb_used)
                    continue;

                if (!tmp->status.valid)
                    continue;

                mpp_assert(!tmp->status.is_non_ref);

                if (!tmp->status.is_lt_ref)
                    continue;

                if (tmp->lt_idx == lt_idx) {
                    tmp->dpb_used = 0;
                    tmp->status.valid = 0;
                    h264e_dbg_dpb("frm %d lt_idx %d replace %d\n",
                                  curr->seq_idx, curr->lt_idx, tmp->slot_idx);
                    dpb->lt_size--;
                    used_size--;
                }
            }
        } else {
            dpb->st_size++;
        }

        if (used_size > dpb_size) {
            mpp_assert(dpb->lt_size <= dpb_size);

            while (used_size > dpb_size) {
                RK_S32 small_poc = 0x7fffffff;
                H264eDpbFrm *unref = NULL;

                h264e_dbg_dpb("sliding window cpb proc: st %d lt %d max %d\n",
                              dpb->st_size, dpb->lt_size, dpb_size);

                for (i = 0; i < dpb->total_cnt; i++) {
                    H264eDpbFrm *tmp = &dpb->frames[i];

                    h264e_dbg_dpb("frm %d num %d poc %d\n",
                                  tmp->seq_idx, tmp->frame_num, tmp->poc);

                    if (tmp->as_pskip_ref)
                        continue;

                    if (!tmp->on_used)
                        continue;

                    if (!tmp->status.valid)
                        continue;

                    mpp_assert(!tmp->status.is_non_ref);

                    if (tmp->status.is_lt_ref)
                        continue;

                    if (tmp->poc < small_poc) {
                        unref = tmp;
                        small_poc = tmp->poc;

                        h264e_dbg_dpb("frm %d update smallest poc to %d\n",
                                      tmp->seq_idx, tmp->poc);
                    }
                }

                if (unref) {
                    h264e_dbg_dpb("removing frm %d poc %d\n",
                                  unref->seq_idx, unref->poc);

                    unref->dpb_used = 0;
                    dpb->st_size--;
                    mpp_assert(dpb->st_size >= 0);
                    used_size--;
                } else
                    break;
            }
        }

        dpb->used_size = used_size;
        if (used_size > dpb_size) {
            mpp_err_f("error found used_size %d > dpb_size %d\n", used_size, dpb_size);
            mpp_assert(used_size <= dpb_size);
        }
    }

    h264e_dbg_dpb("curr %d done used_size %d\n", curr->seq_idx, dpb->used_size);

    RK_S32 used_size = 0;
    for (i = 0; i < MAX_CPB_REFS; i++) {
        dpb->map[i] = find_cpb_frame(dpb, &cpb->final[i]);
        if (dpb->map[i])
            used_size++;
    }

    h264e_dbg_dpb("curr %d cpb final used_size %d vs %d\n",
                  curr->seq_idx, used_size, dpb->used_size);
    mpp_assert(dpb->used_size == used_size);

    h264e_dbg_dpb("leave %p\n", dpb);
}